

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_positional_join.cpp
# Opt level: O2

idx_t __thiscall
duckdb::PositionalJoinGlobalState::CopyData
          (PositionalJoinGlobalState *this,DataChunk *output,idx_t count,idx_t col_offset)

{
  ulong uVar1;
  reference pvVar2;
  reference pvVar3;
  idx_t iVar4;
  ulong uVar5;
  idx_t target_offset;
  ulong uVar6;
  idx_t i;
  
  if ((this->source_offset == 0) && ((count <= (this->source).count || (this->exhausted == true))))
  {
    for (uVar6 = 0;
        iVar4 = ((long)(this->source).data.
                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(this->source).data.
                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x68, uVar6 < iVar4; uVar6 = uVar6 + 1) {
      pvVar2 = vector<duckdb::Vector,_true>::get<true>(&output->data,col_offset + uVar6);
      pvVar3 = vector<duckdb::Vector,_true>::get<true>(&(this->source).data,uVar6);
      Vector::Reference(pvVar2,pvVar3);
    }
    this->source_offset = this->source_offset + count;
  }
  else {
    for (uVar6 = 0; uVar1 = count - uVar6, uVar6 <= count && uVar1 != 0; uVar6 = uVar6 + uVar5) {
      iVar4 = this->source_offset;
      uVar5 = (this->source).count - iVar4;
      if (this->exhausted != false) {
        uVar5 = uVar1;
      }
      if (uVar1 < uVar5) {
        uVar5 = uVar1;
      }
      for (uVar1 = 0;
          uVar1 < (ulong)(((long)(this->source).data.
                                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->source).data.
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_start) / 0x68); uVar1 = uVar1 + 1
          ) {
        pvVar2 = vector<duckdb::Vector,_true>::get<true>(&(this->source).data,uVar1);
        pvVar3 = vector<duckdb::Vector,_true>::get<true>(&output->data,col_offset + uVar1);
        VectorOperations::Copy(pvVar2,pvVar3,iVar4 + uVar5,this->source_offset,uVar6);
      }
      this->source_offset = this->source_offset + uVar5;
      Refill(this);
    }
    iVar4 = ((long)(this->source).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                   .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(this->source).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x68;
  }
  return iVar4;
}

Assistant:

idx_t PositionalJoinGlobalState::CopyData(DataChunk &output, const idx_t count, const idx_t col_offset) {
	if (!source_offset && (source.size() >= count || exhausted)) {
		//	Fast track: aligned and has enough data
		for (idx_t i = 0; i < source.ColumnCount(); ++i) {
			output.data[col_offset + i].Reference(source.data[i]);
		}
		source_offset += count;
	} else {
		// Copy data
		for (idx_t target_offset = 0; target_offset < count;) {
			const auto needed = count - target_offset;
			const auto available = exhausted ? needed : (source.size() - source_offset);
			const auto copy_size = MinValue(needed, available);
			const auto source_count = source_offset + copy_size;
			for (idx_t i = 0; i < source.ColumnCount(); ++i) {
				VectorOperations::Copy(source.data[i], output.data[col_offset + i], source_count, source_offset,
				                       target_offset);
			}
			target_offset += copy_size;
			source_offset += copy_size;
			Refill();
		}
	}

	return source.ColumnCount();
}